

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O2

void __thiscall mdsplit::mdsplitter::find_sections(mdsplitter *this)

{
  path *__lhs;
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  istream *piVar4;
  pointer pmVar5;
  long lVar6;
  _Alloc_hider _Var7;
  pointer pmVar8;
  byte bVar9;
  pointer psVar10;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  long lVar11;
  pointer pmVar12;
  short sVar13;
  uint uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parent_section;
  pointer pbVar15;
  bool bVar16;
  string_view str;
  string_view str_00;
  string current_line;
  smatch sm;
  path local_368;
  mdsection new_section;
  regex ignore_end_regex;
  regex ignore_begin_regex;
  regex header_regex;
  path local_260;
  ifstream fin;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&header_regex,"(^|\\n)(#+) +(.*)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&ignore_begin_regex," *<!-- START mdsplit-ignore --> *",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&ignore_end_regex," *<!-- END mdsplit-ignore --> *",0x10);
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)&fin,&this->input_,_S_in);
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  __lhs = &this->output_dir_;
  bVar16 = false;
  bVar9 = 0;
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&fin,(string *)&current_line);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)&current_line);
      std::ifstream::~ifstream(&fin);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (&ignore_end_regex);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (&ignore_begin_regex);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                (&header_regex);
      return;
    }
    sm.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sm._M_begin._M_current = (char *)0x0;
    sm.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sm.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar2 = is_codeblock(&current_line);
    bVar9 = bVar9 ^ bVar2;
    if (bVar9 == 0) {
      bVar3 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (&current_line,&ignore_begin_regex,0);
      bVar2 = true;
      if (!bVar3) {
        bVar2 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (&current_line,&ignore_end_regex,0);
        if (!bVar2 && !bVar16) {
          bVar2 = std::
                  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            (&current_line,&sm,&header_regex,0);
          if (bVar2) {
            lVar6 = (long)sm.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)sm.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            if ((lVar6 == 0) || (0xfffffffffffffffc < lVar6 / 0x18 - 6U)) {
              psVar10 = (pointer)((long)sm.
                                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x48);
            }
            else {
              psVar10 = sm.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 2;
            }
            sVar13 = (short)*(undefined4 *)
                             &(psVar10->
                              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ).second._M_current -
                     (short)*(undefined4 *)
                             &(psVar10->
                              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ).first._M_current;
            if (psVar10->matched == false) {
              sVar13 = 0;
            }
            if (sVar13 <= this->max_split_level_) {
              mdsection::mdsection(&new_section);
              _Var7._M_p = (pointer)((long)sm.
                                           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)sm.
                                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
              if (((pointer)_Var7._M_p == (pointer)0x0) ||
                 (0xfffffffffffffffb < (long)_Var7._M_p / 0x18 - 7U)) {
                this_00 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)sm.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)_Var7._M_p +
                             -0x48);
              }
              else {
                this_00 = sm.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 3;
              }
              new_section.level = sVar13;
              std::__cxx11::
              sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::str(&local_368._M_pathname,this_00);
              std::__cxx11::string::operator=
                        ((string *)&new_section.header_name,(string *)&local_368);
              std::__cxx11::string::~string((string *)&local_368);
              while ((new_section.header_name._M_string_length != 0 &&
                     (_Var7._M_p = new_section.header_name._M_dataplus._M_p,
                     new_section.header_name._M_dataplus._M_p
                     [new_section.header_name._M_string_length - 1] == ' '))) {
                std::__cxx11::string::pop_back();
              }
              uVar14 = (uint)new_section.level;
              while (2 < (int)uVar14) {
                uVar14 = uVar14 - 1;
                pmVar5 = (this->sections_).
                         super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                _Var7._M_p = (pointer)(this->sections_).
                                      super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                                      ._M_impl.super__Vector_impl_data._M_finish;
                lVar11 = 0;
                for (lVar6 = (long)_Var7._M_p - (long)pmVar5 >> 9; 0 < lVar6; lVar6 = lVar6 + -1) {
                  if (uVar14 == (int)*(short *)((long)&((pointer)((long)_Var7._M_p + -0x80))->level
                                               + lVar11)) {
                    _Var7._M_p = (pointer)((long)&((pointer)_Var7._M_p)->level + lVar11);
                    pmVar8 = (pointer)_Var7._M_p;
                    goto LAB_0011f885;
                  }
                  if (uVar14 == (int)*(short *)((long)&((pointer)((long)_Var7._M_p + -0x100))->level
                                               + lVar11)) {
                    pmVar8 = (pointer)((long)&((pointer)((long)_Var7._M_p + -0x80))->level + lVar11)
                    ;
                    goto LAB_0011f885;
                  }
                  if (uVar14 == (int)*(short *)((long)&((pointer)((long)_Var7._M_p + -0x180))->level
                                               + lVar11)) {
                    pmVar8 = (pointer)((long)&((pointer)((long)_Var7._M_p + -0x100))->level + lVar11
                                      );
                    goto LAB_0011f885;
                  }
                  if (uVar14 == (int)*(short *)((long)&((pointer)((long)_Var7._M_p + -0x200))->level
                                               + lVar11)) {
                    pmVar8 = (pointer)((long)&((pointer)((long)_Var7._M_p + -0x180))->level + lVar11
                                      );
                    goto LAB_0011f885;
                  }
                  lVar11 = lVar11 + -0x200;
                }
                lVar6 = ((long)_Var7._M_p - (long)pmVar5) + lVar11 >> 7;
                pmVar12 = (pointer)((long)&((pointer)_Var7._M_p)->level + lVar11);
                if (lVar6 == 3) {
                  pmVar8 = pmVar12;
                  if (uVar14 != (int)pmVar12[-1].level) {
                    pmVar12 = (pointer)((long)&((pointer)((long)_Var7._M_p + -0x80))->level + lVar11
                                       );
                    goto LAB_0011f865;
                  }
                }
                else {
                  if (lVar6 == 2) {
LAB_0011f865:
                    _Var7._M_p = (pointer)(ulong)(uint)(int)pmVar12[-1].level;
                    pmVar8 = pmVar12;
                    if (uVar14 == (int)pmVar12[-1].level) goto LAB_0011f885;
                    pmVar12 = pmVar12 + -1;
                  }
                  else {
                    pmVar8 = pmVar5;
                    if (lVar6 != 1) goto LAB_0011f885;
                  }
                  _Var7._M_p = (pointer)(ulong)(uint)(int)pmVar12[-1].level;
                  pmVar8 = pmVar12;
                  if (uVar14 != (int)pmVar12[-1].level) {
                    pmVar8 = pmVar5;
                  }
                }
LAB_0011f885:
                if (pmVar5 != pmVar8) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&new_section.parent_headers,
                           (const_iterator)
                           new_section.parent_headers.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,&pmVar8[-1].header_name);
                }
              }
              if ((this->sections_).
                  super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  (this->sections_).
                  super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                          (&local_260,(char (*) [9])"index.md",auto_format);
                std::filesystem::__cxx11::operator/(&local_368,__lhs,&local_260);
                std::filesystem::__cxx11::path::operator=(&new_section.filepath,&local_368);
                std::filesystem::__cxx11::path::~path(&local_368);
                std::filesystem::__cxx11::path::~path(&local_260);
                std::__cxx11::string::assign((char *)&new_section.header_name);
              }
              else {
                std::filesystem::__cxx11::path::operator=(&new_section.filepath,__lhs);
                pbVar1 = new_section.parent_headers.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar15 = new_section.parent_headers.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar1;
                    pbVar15 = pbVar15 + 1) {
                  str._M_str = _Var7._M_p;
                  str._M_len = (size_t)(pbVar15->_M_dataplus)._M_p;
                  slugify_abi_cxx11_(&local_368._M_pathname,(mdsplitter *)pbVar15->_M_string_length,
                                     str);
                  std::filesystem::__cxx11::path::operator/=
                            (&new_section.filepath,&local_368._M_pathname);
                  std::__cxx11::string::~string((string *)&local_368);
                }
                str_00._M_str = _Var7._M_p;
                str_00._M_len = (size_t)new_section.header_name._M_dataplus._M_p;
                slugify_abi_cxx11_(&local_368._M_pathname,
                                   (mdsplitter *)new_section.header_name._M_string_length,str_00);
                std::filesystem::__cxx11::path::operator/=
                          (&new_section.filepath,&local_368._M_pathname);
                std::__cxx11::string::~string((string *)&local_368);
                std::filesystem::__cxx11::path::operator+=(&new_section.filepath,".md");
              }
              std::filesystem::__cxx11::path::parent_path();
              std::filesystem::create_directory(&local_368);
              std::filesystem::__cxx11::path::~path(&local_368);
              std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::push_back
                        (&this->sections_,&new_section);
              mdsection::~mdsection(&new_section);
            }
          }
          goto LAB_0011f565;
        }
        bVar2 = (bool)(!bVar2 & bVar16);
      }
    }
    else {
LAB_0011f565:
      pmVar5 = (this->sections_).
               super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
               super__Vector_impl_data._M_start;
      pmVar8 = (this->sections_).
               super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((pmVar5 == pmVar8) && (current_line._M_string_length != 0)) {
        mdsection::mdsection(&new_section);
        new_section.level = 0;
        std::__cxx11::string::assign((char *)&new_section.header_name);
        std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                  (&local_260,(char (*) [9])"index.md",auto_format);
        std::filesystem::__cxx11::operator/(&local_368,__lhs,&local_260);
        std::filesystem::__cxx11::path::operator=(&new_section.filepath,&local_368);
        std::filesystem::__cxx11::path::~path(&local_368);
        std::filesystem::__cxx11::path::~path(&local_260);
        std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::push_back
                  (&this->sections_,&new_section);
        mdsection::~mdsection(&new_section);
        pmVar5 = (this->sections_).
                 super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pmVar8 = (this->sections_).
                 super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      }
      bVar2 = bVar16;
      if (pmVar5 != pmVar8) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pmVar8[-1].lines,&current_line);
      }
    }
    bVar16 = bVar2;
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&sm);
  } while( true );
}

Assistant:

void mdsplitter::find_sections() {
        // # some text
        std::regex header_regex{"(^|\\n)(#+) +(.*)"};

        std::regex ignore_begin_regex{R"( *<!-- START mdsplit-ignore --> *)"};
        std::regex ignore_end_regex{R"( *<!-- END mdsplit-ignore --> *)"};

        /*
         * # some text
         * std::regex h1_regex{"# +(.*)"};
         * // ## some text
         * std::regex h2_regex{"## +(.*)"};
         * // ### some text
         * std::regex h3_regex{"### +(.*)"};
         */
        std::ifstream fin(input_);

        std::string current_line;
        bool inside_codeblock = false;
        bool inside_ignoreblock = false;

        while (std::getline(fin, current_line)) {
            std::smatch sm;

            if (is_codeblock(current_line)) {
                inside_codeblock = 1 - inside_codeblock;
            }

            if (!inside_codeblock) {
                if (std::regex_match(current_line, ignore_begin_regex)) {
                    inside_ignoreblock = true;
                    continue;
                } else if (std::regex_match(current_line, ignore_end_regex)) {
                    inside_ignoreblock = false;
                    continue;
                }
                if (inside_ignoreblock) {
                    continue;
                }

                bool found_header =
                    std::regex_search(current_line, sm, header_regex);
                if (found_header) {
                    short level = sm[2].length();
                    if (level <= max_split_level_) {
                        // Create new section
                        mdsection new_section;
                        new_section.level = level;
                        new_section.header_name = sm[3].str();
                        while (!new_section.header_name.empty() &&
                               new_section.header_name.back() == ' ') {
                            new_section.header_name.pop_back();
                        }

                        // Find its parent headers
                        // For each level below this section's (ignoring level
                        // 1)
                        for (int i = new_section.level - 1; i > 1; --i) {
                            // Find some section with this lower level
                            auto it = std::find_if(sections_.rbegin(),
                                                   sections_.rend(),
                                                   [&i](const mdsection &s) {
                                                       return s.level == i;
                                                   });
                            // If we found it
                            if (it != sections_.rend()) {
                                // Then this is the parent
                                new_section.parent_headers.insert(
                                    new_section.parent_headers.begin(),
                                    it->header_name);
                            }
                        }
                        bool first_section = sections_.empty();
                        if (first_section) {
                            new_section.filepath = output_dir_ / "index.md";
                            new_section.header_name = "Home";
                        } else {
                            new_section.filepath = output_dir_;
                            for (const auto &parent_section :
                                 new_section.parent_headers) {
                                new_section.filepath /= slugify(parent_section);
                            }
                            new_section.filepath /=
                                slugify(new_section.header_name);
                            new_section.filepath += ".md";
                        }
                        fs::create_directory(
                            new_section.filepath.parent_path());
                        sections_.push_back(new_section);
                    }
                }
            }

            // Make sure there's at least one default section
            bool found_text_before_any_section = sections_.empty();
            if (found_text_before_any_section && !current_line.empty()) {
                mdsection new_section;
                new_section.level = 0;
                new_section.header_name = "";
                new_section.filepath = output_dir_ / "index.md";
                sections_.push_back(new_section);
            }

            // Store line
            if (!sections_.empty()) {
                sections_.back().lines.push_back(std::move(current_line));
            }
        }
    }